

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

void bmp24toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  OPJ_BYTE *pOVar5;
  int iVar6;
  OPJ_UINT8 *pOVar7;
  OPJ_UINT32 OVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  OVar1 = image->y1;
  if (OVar1 != 0) {
    uVar2 = image->x1;
    pOVar7 = pData + (OVar1 - 1) * stride;
    OVar8 = 0;
    iVar9 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        lVar10 = (long)iVar9 * 4;
        lVar3 = *(long *)(image + 1);
        lVar4 = *(long *)&image[2].numcomps;
        pOVar5 = image[3].icc_profile_buf;
        uVar12 = 0;
        uVar11 = 0;
        do {
          iVar6 = (int)uVar12;
          *(uint *)(lVar3 + lVar10 + uVar11 * 4) = (uint)pOVar7[iVar6 + 2];
          *(uint *)(lVar4 + lVar10 + uVar11 * 4) = (uint)pOVar7[iVar6 + 1];
          *(uint *)(pOVar5 + uVar11 * 4 + lVar10) = (uint)pOVar7[uVar12];
          uVar11 = uVar11 + 1;
          uVar12 = (ulong)(iVar6 + 3);
        } while (uVar2 != uVar11);
        iVar9 = iVar9 + (int)uVar11;
      }
      pOVar7 = pOVar7 + -(ulong)stride;
      OVar8 = OVar8 + 1;
    } while (OVar8 != OVar1);
  }
  return;
}

Assistant:

static void bmp24toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                         opj_image_t* image)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            image->comps[0].data[index] = (OPJ_INT32)pSrc[3 * x + 2]; /* R */
            image->comps[1].data[index] = (OPJ_INT32)pSrc[3 * x + 1]; /* G */
            image->comps[2].data[index] = (OPJ_INT32)pSrc[3 * x + 0]; /* B */
            index++;
        }
        pSrc -= stride;
    }
}